

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetDampingFn(void *kinmem,KINDampingFn damping_fn)

{
  undefined8 in_RSI;
  long in_RDI;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == 0) {
    KINProcessError((KINMem)0x0,-1,0xfc,"KINSetDampingFn",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else {
    *(undefined8 *)(in_RDI + 0x1d0) = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int KINSetDampingFn(void* kinmem, KINDampingFn damping_fn)
{
  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return KIN_MEM_NULL;
  }
  KINMem kin_mem = (KINMem)kinmem;

  kin_mem->kin_damping_fn = damping_fn;

  return KIN_SUCCESS;
}